

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O1

Promise<void> __thiscall
capnp::
Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
::sendIgnoringResult
          (Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
           *this)

{
  long *plVar1;
  OwnPromiseNode node;
  long lVar2;
  undefined8 uVar3;
  long in_RSI;
  RemotePromise<capnp::AnyPointer> typelessPromise;
  void *continuationTracePtr;
  anon_class_1_0_00000001_for_func local_59;
  OwnPromiseNode local_58;
  undefined8 *local_50;
  long *local_48;
  long local_40;
  undefined8 uStack_38;
  undefined8 *local_30;
  SegmentBuilder *local_28;
  code *local_20;
  
  (**(code **)**(undefined8 **)(in_RSI + 0x30))(&local_58);
  plVar1 = *(long **)(in_RSI + 0x30);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)(in_RSI + 0x30) = 0;
    (**(code **)**(undefined8 **)(in_RSI + 0x28))
              (*(undefined8 **)(in_RSI + 0x28),(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  local_20 = kj::_::
             SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h:260:68)>
             ::anon_class_1_0_00000001_for_func::operator();
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,kj::Promise<capnp::Response<capnp::AnyPointer>>::ignoreResult()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_>,kj::_::PromiseDisposer,kj::Promise<capnp::Response<capnp::AnyPointer>>::ignoreResult()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,void*&>
            ((PromiseDisposer *)&local_28,&local_58,&local_59,&local_20);
  uVar3 = uStack_38;
  lVar2 = local_40;
  (this->super_Builder)._builder.segment = local_28;
  if (local_40 != 0) {
    local_40 = 0;
    uStack_38 = 0;
    (**(code **)*local_30)(local_30,lVar2,8,uVar3,uVar3,0);
  }
  plVar1 = local_48;
  if (local_48 != (long *)0x0) {
    local_48 = (long *)0x0;
    (**(code **)*local_50)(local_50,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  node.ptr = local_58.ptr;
  if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> Request<Params, Results>::sendIgnoringResult() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse
  return kj::mv(typelessPromise).ignoreResult();
}